

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

void event_queue_remove_active_later(event_base *base,event_callback *evcb)

{
  event_callback *peVar1;
  event_callback **ppeVar2;
  int iVar3;
  
  if ((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) {
    iVar3 = evthread_is_debug_lock_held_(base->th_base_lock);
    if (iVar3 == 0) {
      event_queue_remove_active_later_cold_1();
    }
  }
  if ((evcb->evcb_flags & 0x20U) != 0) {
    base->event_count = base->event_count - (uint)((evcb->evcb_flags & 0x10U) == 0);
    *(byte *)&evcb->evcb_flags = (byte)evcb->evcb_flags & 0xdf;
    base->event_count_active = base->event_count_active + -1;
    peVar1 = (evcb->evcb_active_next).tqe_next;
    if (peVar1 == (event_callback *)0x0) {
      peVar1 = (event_callback *)&base->active_later_queue;
    }
    ppeVar2 = (evcb->evcb_active_next).tqe_prev;
    (peVar1->evcb_active_next).tqe_prev = ppeVar2;
    *ppeVar2 = (evcb->evcb_active_next).tqe_next;
    return;
  }
  event_errx(1,"%s: %p not on queue %x","event_queue_remove_active_later",evcb,0x20);
}

Assistant:

static void
event_queue_remove_active_later(struct event_base *base, struct event_callback *evcb)
{
	EVENT_BASE_ASSERT_LOCKED(base);
	if (EVUTIL_FAILURE_CHECK(!(evcb->evcb_flags & EVLIST_ACTIVE_LATER))) {
		event_errx(1, "%s: %p not on queue %x", __func__,
			   evcb, EVLIST_ACTIVE_LATER);
		return;
	}
	DECR_EVENT_COUNT(base, evcb->evcb_flags);
	evcb->evcb_flags &= ~EVLIST_ACTIVE_LATER;
	base->event_count_active--;

	TAILQ_REMOVE(&base->active_later_queue, evcb, evcb_active_next);
}